

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O1

void client_connect(void)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *plVar5;
  undefined8 uVar6;
  long *plVar7;
  void *pvVar8;
  undefined8 *extraout_RDX;
  undefined8 *__size;
  long *plVar9;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  undefined8 uStack_a8;
  long lStack_a0;
  code *pcStack_98;
  code *pcStack_90;
  undefined8 uStack_88;
  long lStack_80;
  long *plStack_78;
  long *plStack_70;
  long lStack_50;
  long *plStack_48;
  code *pcStack_40;
  undefined8 local_30;
  long local_28;
  undefined1 local_20 [16];
  
  pcStack_40 = (code *)0x184e73;
  plVar4 = (long *)malloc(0xd8);
  pcStack_40 = (code *)0x184e80;
  plVar5 = (long *)malloc(0x68);
  pcStack_40 = (code *)0x184e99;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,local_20);
  local_28 = (long)iVar2;
  local_30 = 0;
  if (local_28 == 0) {
    if (plVar4 == (long *)0x0) goto LAB_00184f35;
    if (plVar5 == (long *)0x0) goto LAB_00184f3a;
    pcStack_40 = (code *)0x184ec4;
    uVar6 = uv_default_loop();
    pcStack_40 = (code *)0x184ecf;
    iVar2 = uv_tcp_init(uVar6,plVar4);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 != 0) goto LAB_00184f3f;
    pcStack_40 = (code *)0x184f02;
    iVar2 = uv_tcp_connect(plVar5,plVar4,local_20,connect_cb);
    local_28 = (long)iVar2;
    local_30 = 0;
    if (local_28 == 0) {
      return;
    }
  }
  else {
    pcStack_40 = (code *)0x184f35;
    client_connect_cold_1();
LAB_00184f35:
    pcStack_40 = (code *)0x184f3a;
    client_connect_cold_5();
LAB_00184f3a:
    pcStack_40 = (code *)0x184f3f;
    client_connect_cold_4();
LAB_00184f3f:
    pcStack_40 = (code *)0x184f4e;
    client_connect_cold_2();
  }
  plVar9 = &local_28;
  iVar2 = (int)&local_30;
  pcStack_40 = connection_cb;
  client_connect_cold_3();
  lStack_50 = (long)iVar2;
  plStack_48 = plVar4;
  pcStack_40 = (code *)plVar5;
  if (lStack_50 == 0) {
    plVar7 = (long *)malloc(0x78);
    plVar4 = plVar9;
    if (plVar7 == (long *)0x0) goto LAB_0018501c;
    uVar6 = uv_default_loop();
    iVar2 = uv_timer_init(uVar6,plVar7);
    lStack_50 = (long)iVar2;
    plVar5 = plVar7;
    if (lStack_50 != 0) goto LAB_00185021;
    *plVar7 = (long)plVar9;
    iVar2 = uv_timer_start(plVar7,do_accept,1000,0);
    lStack_50 = (long)iVar2;
    if (lStack_50 == 0) {
      connection_cb_called = connection_cb_called + 1;
      return;
    }
  }
  else {
    connection_cb_cold_1();
LAB_0018501c:
    connection_cb_cold_4();
LAB_00185021:
    connection_cb_cold_2();
  }
  plVar9 = &lStack_50;
  connection_cb_cold_3();
  iVar2 = (int)&uStack_88;
  pcStack_90 = (code *)0x185055;
  plStack_78 = plVar4;
  plStack_70 = plVar5;
  pvVar8 = malloc(0xd8);
  if (plVar9 == (long *)0x0) {
    pcStack_90 = (code *)0x185106;
    do_accept_cold_4();
LAB_00185106:
    pcStack_90 = (code *)0x18510b;
    do_accept_cold_3();
LAB_0018510b:
    pcStack_90 = (code *)0x185118;
    do_accept_cold_1();
  }
  else {
    if (pvVar8 == (void *)0x0) goto LAB_00185106;
    pcStack_90 = (code *)0x18506f;
    uVar6 = uv_default_loop();
    pcStack_90 = (code *)0x18507a;
    iVar3 = uv_tcp_init(uVar6,pvVar8);
    lStack_80 = (long)iVar3;
    uStack_88 = 0;
    if (lStack_80 != 0) goto LAB_0018510b;
    lVar1 = *plVar9;
    pcStack_90 = (code *)0x1850a2;
    iVar3 = uv_accept(lVar1,pvVar8);
    lStack_80 = (long)iVar3;
    uStack_88 = 0;
    if (lStack_80 == 0) {
      do_accept_called = do_accept_called + 1;
      pcStack_90 = (code *)0x1850d1;
      uv_close(pvVar8,close_cb);
      if (do_accept_called == 2) {
        pcStack_90 = (code *)0x1850e9;
        uv_close(lVar1,close_cb);
      }
      uv_close(plVar9,close_cb);
      return;
    }
  }
  plVar4 = &lStack_80;
  pcStack_90 = close_cb;
  do_accept_cold_2();
  if (plVar4 != (long *)0x0) {
    pcStack_98 = (code *)0x185130;
    free(plVar4);
    close_cb_called = close_cb_called + 1;
    return;
  }
  pcStack_98 = connect_cb;
  close_cb_cold_1();
  __size = &uStack_a8;
  pcStack_98 = (code *)plVar9;
  if (plVar4 == (long *)0x0) {
    connect_cb_cold_3();
  }
  else {
    lStack_a0 = (long)iVar2;
    uStack_a8 = 0;
    if (lStack_a0 == 0) {
      iVar2 = uv_read_start(plVar4[10],alloc_cb,read_cb);
      lStack_a0 = (long)iVar2;
      uStack_a8 = 0;
      if (lStack_a0 == 0) {
        connect_cb_called = connect_cb_called + 1;
        free(plVar4);
        return;
      }
      goto LAB_001851bb;
    }
  }
  connect_cb_cold_1();
LAB_001851bb:
  connect_cb_cold_2();
  pvVar8 = malloc((size_t)__size);
  *extraout_RDX = pvVar8;
  extraout_RDX[1] = __size;
  return;
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_NOT_NULL(client);
  ASSERT_NOT_NULL(connect_req);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT_OK(r);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);
}